

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

void __thiscall
gl4cts::QuadsBufferStorageTestCase::initSparseBO
          (QuadsBufferStorageTestCase *this,bool decommit_data_pages_after_upload,
          bool is_dynamic_storage)

{
  GLenum GVar1;
  int iVar2;
  char *pcVar3;
  
  if (this->m_data == (uchar *)0x0) {
    createTestData(this,&this->m_data,&this->m_vbo_data_offset,&this->m_ibo_data_offset,
                   &this->m_color_data_offset);
  }
  (*this->m_gl->bufferPageCommitmentARB)(0x8892,0,(ulong)this->m_data_size_rounded,'\x01');
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x106f);
  (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1072);
  this->m_pages_committed = true;
  if (is_dynamic_storage) {
    (*this->m_gl->bufferSubData)(0x8892,0,(ulong)this->m_data_size,this->m_data);
    GVar1 = (*this->m_gl->getError)();
    pcVar3 = "glBufferSubData() call failed.";
    iVar2 = 0x107b;
  }
  else {
    (*this->m_gl->copyBufferSubData)(0x8f36,0x8892,0,0,(ulong)this->m_data_size);
    GVar1 = (*this->m_gl->getError)();
    pcVar3 = "glCopyBufferSubData() call failed.";
    iVar2 = 0x1083;
  }
  glu::checkError(GVar1,pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,iVar2);
  (*this->m_gl->vertexAttribPointer)
            (this->m_attribute_position_location,4,0x1406,'\0',0,
             (void *)(ulong)this->m_vbo_data_offset);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glVertexAttribPointer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x108b);
  (*this->m_gl->enableVertexAttribArray)(this->m_attribute_position_location);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glEnableVertexAttribPointer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x108e);
  if (this->m_use_color_data == true) {
    (*this->m_gl->vertexAttribPointer)
              (this->m_attribute_color_location,4,0x1401,'\x01',0,
               (void *)(ulong)this->m_color_data_offset);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glVertexAttribPointer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x1096);
    (*this->m_gl->enableVertexAttribArray)(this->m_attribute_color_location);
    GVar1 = (*this->m_gl->getError)();
    pcVar3 = "glEnableVertexAttribPointer() call failed.";
    iVar2 = 0x1099;
  }
  else {
    (*this->m_gl->vertexAttrib4f)(this->m_attribute_color_location,1.0,1.0,1.0,1.0);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glVertexAttrib4f() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x109e);
    (*this->m_gl->disableVertexAttribArray)(this->m_attribute_color_location);
    GVar1 = (*this->m_gl->getError)();
    pcVar3 = "glDisableVertexAttribArray() call failed.";
    iVar2 = 0x10a1;
  }
  glu::checkError(GVar1,pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,iVar2);
  if (this->m_ibo_usage != IBO_USAGE_NONE) {
    (*this->m_gl->bindBuffer)(0x8893,this->m_sparse_bo);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBindBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x10a7);
  }
  if (decommit_data_pages_after_upload) {
    (*this->m_gl->bufferPageCommitmentARB)(0x8892,0,(ulong)this->m_data_size_rounded,'\0');
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x10b1);
    this->m_pages_committed = false;
  }
  return;
}

Assistant:

void QuadsBufferStorageTestCase::initSparseBO(bool decommit_data_pages_after_upload, bool is_dynamic_storage)
{
	/* Set up the vertex buffer object. */
	if (m_data == DE_NULL)
	{
		createTestData(&m_data, &m_vbo_data_offset, &m_ibo_data_offset, &m_color_data_offset);
	}
	else
	{
		/* Sanity checks */
		if (m_ibo_usage != IBO_USAGE_NONE)
		{
			DE_ASSERT(m_vbo_data_offset != m_ibo_data_offset);
		}

		if (m_use_color_data)
		{
			DE_ASSERT(m_vbo_data_offset != m_ibo_data_offset);
			DE_ASSERT(m_ibo_data_offset != m_color_data_offset);
		}
	}

	/* Commit as many pages as we need to upload the data */
	m_gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0,			/* offset */
								 m_data_size_rounded, GL_TRUE); /* commit */
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_pages_committed = true;

	/* Upload the data */
	if (is_dynamic_storage)
	{
		m_gl.bufferSubData(GL_ARRAY_BUFFER, 0, /* offset */
						   m_data_size, m_data);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferSubData() call failed.");
	}
	else
	{
		/* Sparse BO cannot be directly uploaded data to. Copy the data from a helper BO */
		m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_ARRAY_BUFFER, 0, /* readOffset */
							   0,										/* writeOffset */
							   m_data_size);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");
	}

	/* Set the VAO up */
	m_gl.vertexAttribPointer(m_attribute_position_location, 4, /* size */
							 GL_FLOAT, GL_FALSE,			   /* normalized */
							 0,								   /* stride */
							 (glw::GLvoid*)(intptr_t)m_vbo_data_offset);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glVertexAttribPointer() call failed.");

	m_gl.enableVertexAttribArray(m_attribute_position_location); /* index */
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glEnableVertexAttribPointer() call failed.");

	if (m_use_color_data)
	{
		m_gl.vertexAttribPointer(m_attribute_color_location, 4, /* size */
								 GL_UNSIGNED_BYTE, GL_TRUE,		/* normalized */
								 0,								/* stride */
								 (glw::GLvoid*)(intptr_t)m_color_data_offset);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glVertexAttribPointer() call failed.");

		m_gl.enableVertexAttribArray(m_attribute_color_location); /* index */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glEnableVertexAttribPointer() call failed.");
	}
	else
	{
		m_gl.vertexAttrib4f(m_attribute_color_location, 1.0f, 1.0f, 1.0f, 1.0f);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glVertexAttrib4f() call failed.");

		m_gl.disableVertexAttribArray(m_attribute_color_location);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDisableVertexAttribArray() call failed.");
	}

	if (m_ibo_usage != IBO_USAGE_NONE)
	{
		m_gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_sparse_bo);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");
	} /* if (m_use_ibo) */

	/* If we were requested to do so, decommit the pages we have just uploaded
	 * the data to.
	 */
	if (decommit_data_pages_after_upload)
	{
		m_gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0,			 /* offset */
									 m_data_size_rounded, GL_FALSE); /* commit */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

		m_pages_committed = false;
	} /* if (decommit_data_pages_after_upload) */
}